

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest4::iterate(NegativeTest4 *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  GLint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  long lVar6;
  NotSupportedError *this_01;
  _test_case _Var7;
  _shader_stage *shader_stage;
  char *pcVar8;
  ulong uVar9;
  _test_case local_21c;
  GLint compile_status;
  uint local_214;
  ulong local_210;
  GLenum local_208;
  _test_case local_204;
  long local_200;
  char *body_raw_ptr;
  string body;
  string local_1d0;
  undefined1 local_1b0 [384];
  long lVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  pcVar8 = "GL_ARB_shader_subroutine";
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar1) {
    uVar9 = 0;
    while ((int)uVar9 != 5) {
      local_1b0._0_4_ = (int)uVar9;
      local_208 = Utils::getGLenumForShaderStage((_shader_stage *)local_1b0);
      lVar6 = 1;
      local_210 = uVar9;
      while (local_214 = (uint)lVar6, lVar6 != 6) {
        _Var7 = TEST_CASE_FIRST;
        local_200 = lVar6;
        while( true ) {
          if (_Var7 == TEST_CASE_COUNT) break;
          body._M_dataplus._M_p = (pointer)&body.field_2;
          body._M_string_length = 0;
          body_raw_ptr = (char *)0x0;
          compile_status = 0;
          body.field_2._M_local_buf[0] = '\0';
          local_1d0._M_dataplus._M_p._0_4_ = (undefined4)local_210;
          local_21c = _Var7;
          local_204 = _Var7;
          getShaderBody_abi_cxx11_
                    ((string *)local_1b0,(NegativeTest4 *)pcVar8,(_shader_stage *)&local_1d0,
                     &local_214,&local_21c);
          std::__cxx11::string::operator=((string *)&body,(string *)local_1b0);
          std::__cxx11::string::~string((string *)local_1b0);
          body_raw_ptr = body._M_dataplus._M_p;
          GVar3 = (**(code **)(lVar5 + 0x3f0))(local_208);
          this->m_so_id = GVar3;
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"glCreateShader() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x2eba);
          (**(code **)(lVar5 + 0x12b8))(this->m_so_id,1,&body_raw_ptr,0);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"glShaderSource() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x2ebd);
          (**(code **)(lVar5 + 0x248))(this->m_so_id);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"glCompileShader() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x2ec0);
          (**(code **)(lVar5 + 0xa70))(this->m_so_id,0x8b81,&compile_status);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"glGetShaderiv() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x2ec3);
          if (compile_status == 1) {
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
            std::operator<<((ostream *)(local_1b0 + 8),"A malformed ");
            local_21c = (_test_case)local_210;
            Utils::getShaderStageString_abi_cxx11_(&local_1d0,(Utils *)&local_21c,shader_stage);
            this_00 = (ostringstream *)(local_1b0 + 8);
            std::operator<<((ostream *)this_00,(string *)&local_1d0);
            std::operator<<((ostream *)this_00," compiled successfully (");
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::operator<<((ostream *)this_00," subroutine types were defined).");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            this->m_has_test_passed = false;
          }
          (**(code **)(lVar5 + 0x470))(this->m_so_id);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          pcVar8 = "glDeleteShader() call failed.";
          glu::checkError(dVar4,"glDeleteShader() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x2ed4);
          std::__cxx11::string::~string((string *)&body);
          _Var7 = local_204 + TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST;
        }
        lVar6 = local_200 + 1;
      }
      uVar9 = (ulong)((int)local_210 + 1);
    }
    bVar1 = this->m_has_test_passed == false;
    if (bVar1) {
      pcVar8 = "Fail";
    }
    else {
      pcVar8 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar1,pcVar8);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"GL_ARB_shader_subroutine is not supported.",
             (allocator<char> *)&body);
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b0);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult NegativeTest4::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Iterate over all shader stages.. */
	for (int shader_stage = static_cast<int>(Utils::SHADER_STAGE_FIRST);
		 shader_stage != static_cast<int>(Utils::SHADER_STAGE_COUNT); ++shader_stage)
	{
		/* For each shader stage, we will be trying to compile a number of invalid shaders.
		 * Each shader defines N different subroutine types. (N-1) of them are compatible
		 * with a subroutine, but exactly 1 will be mismatched. The test passes if GLSL
		 * compiler correctly detects that all shaders we will be trying to compile are
		 * broken.
		 */
		const glw::GLenum shader_type = Utils::getGLenumForShaderStage(static_cast<Utils::_shader_stage>(shader_stage));

		for (unsigned int n_subroutine_types = 1; n_subroutine_types < 6; /* arbitrary number */
			 ++n_subroutine_types)
		{
			for (int test_case = static_cast<int>(TEST_CASE_FIRST); test_case != static_cast<int>(TEST_CASE_COUNT);
				 ++test_case)
			{
				std::string body;
				const char* body_raw_ptr   = NULL;
				glw::GLint  compile_status = GL_FALSE;

				body = getShaderBody(static_cast<Utils::_shader_stage>(shader_stage), n_subroutine_types,
									 static_cast<_test_case>(test_case));
				body_raw_ptr = body.c_str();

				/* Try to compile the shader */
				m_so_id = gl.createShader(shader_type);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

				gl.shaderSource(m_so_id, 1 /* count */, &body_raw_ptr, DE_NULL);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

				gl.compileShader(m_so_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed");

				gl.getShaderiv(m_so_id, GL_COMPILE_STATUS, &compile_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

				if (compile_status == GL_TRUE)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A malformed "
									   << Utils::getShaderStageString(static_cast<Utils::_shader_stage>(shader_stage))
									   << " compiled successfully "
										  "("
									   << n_subroutine_types << " subroutine types "
																"were defined)."
									   << tcu::TestLog::EndMessage;

					m_has_test_passed = false;
				}

				/* Release the object */
				gl.deleteShader(m_so_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed.");
			} /* for (all test cases) */
		}	 /* for (a number of different subroutine type declarations) */
	}		  /* for (all shader stages) */

	/* Done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}